

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

void __thiscall
iutest::detail::ContainsMatcher<iutest::detail::GtMatcher<int>_>::~ContainsMatcher
          (ContainsMatcher<iutest::detail::GtMatcher<int>_> *this)

{
  ContainsMatcher<iutest::detail::GtMatcher<int>_> *this_local;
  
  ~ContainsMatcher(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

class ContainsMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    explicit ContainsMatcher(const T& expected) : m_expected(expected) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        IUTEST_USING_BEGIN_END();
        if IUTEST_COND_LIKELY( Contains(begin(actual), end(actual)) )
        {
            return AssertionSuccess();
        }
        return AssertionFailure() << WhichIs();
    }

public:
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        iu_global_format_stringstream strm;
        strm << "Contains: " << m_expected;
        return strm.str();
    }